

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_unittest.cc
# Opt level: O2

void Test_Template_TemplateCache::Run(void)

{
  long lVar1;
  long lVar2;
  allocator local_69;
  undefined1 local_68 [32];
  string filename_b;
  string filename_a;
  
  std::__cxx11::string::string((string *)&filename_b,"Test template 1",(allocator *)local_68);
  ctemplate::StringToTemplateFile(&filename_a,&filename_b);
  std::__cxx11::string::~string((string *)&filename_b);
  std::__cxx11::string::string((string *)local_68,"Test template 2.",&local_69);
  ctemplate::StringToTemplateFile(&filename_b,(string *)local_68);
  std::__cxx11::string::~string((string *)local_68);
  local_68._0_8_ = filename_a._M_dataplus._M_p;
  local_68._8_8_ = filename_a._M_string_length;
  local_68[0x10] = '\0';
  local_68._24_8_ = 0;
  lVar1 = ctemplate::Template::GetTemplate((TemplateString *)local_68,DO_NOT_STRIP);
  if (lVar1 == 0) {
    printf("ASSERT FAILED, line %d: %s\n",0x516,
           "tpl = Template::GetTemplate(filename_a, DO_NOT_STRIP)");
    local_68._0_8_ = filename_a._M_dataplus._M_p;
    local_68._8_8_ = filename_a._M_string_length;
    local_68[0x10] = '\0';
    local_68._24_8_ = 0;
    lVar1 = ctemplate::Template::GetTemplate((TemplateString *)local_68,DO_NOT_STRIP);
    if (lVar1 == 0) {
      __assert_fail("tpl = Template::GetTemplate(filename_a, DO_NOT_STRIP)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x516,"static void Test_Template_TemplateCache::Run()");
    }
  }
  else {
    local_68._0_8_ = filename_b._M_dataplus._M_p;
    local_68._8_8_ = filename_b._M_string_length;
    local_68[0x10] = '\0';
    local_68._24_8_ = 0;
    lVar2 = ctemplate::Template::GetTemplate((TemplateString *)local_68,DO_NOT_STRIP);
    if (lVar2 == 0) {
      printf("ASSERT FAILED, line %d: %s\n",0x518,
             "tpl2 = Template::GetTemplate(filename_b, DO_NOT_STRIP)");
      local_68._0_8_ = filename_b._M_dataplus._M_p;
      local_68._8_8_ = filename_b._M_string_length;
      local_68[0x10] = '\0';
      local_68._24_8_ = 0;
      lVar1 = ctemplate::Template::GetTemplate((TemplateString *)local_68,DO_NOT_STRIP);
      if (lVar1 == 0) {
        __assert_fail("tpl2 = Template::GetTemplate(filename_b, DO_NOT_STRIP)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                      ,0x518,"static void Test_Template_TemplateCache::Run()");
      }
    }
    else {
      if (lVar2 == lVar1) {
        printf("ASSERT FAILED, line %d: %s\n",0x519,"tpl2 != tpl");
        __assert_fail("tpl2 != tpl",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                      ,0x519,"static void Test_Template_TemplateCache::Run()");
      }
      local_68._0_8_ = filename_a._M_dataplus._M_p;
      local_68._8_8_ = filename_a._M_string_length;
      local_68[0x10] = '\0';
      local_68._24_8_ = 0;
      lVar2 = ctemplate::Template::GetTemplate((TemplateString *)local_68,STRIP_BLANK_LINES);
      if (lVar2 == 0) {
        printf("ASSERT FAILED, line %d: %s\n",0x51a,
               "tpl2 = Template::GetTemplate(filename_a, STRIP_BLANK_LINES)");
        local_68._0_8_ = filename_a._M_dataplus._M_p;
        local_68._8_8_ = filename_a._M_string_length;
        local_68[0x10] = '\0';
        local_68._24_8_ = 0;
        lVar1 = ctemplate::Template::GetTemplate((TemplateString *)local_68,STRIP_BLANK_LINES);
        if (lVar1 == 0) {
          __assert_fail("tpl2 = Template::GetTemplate(filename_a, STRIP_BLANK_LINES)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                        ,0x51a,"static void Test_Template_TemplateCache::Run()");
        }
      }
      else {
        if (lVar2 == lVar1) {
          printf("ASSERT FAILED, line %d: %s\n",0x51b,"tpl2 != tpl");
          __assert_fail("tpl2 != tpl",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                        ,0x51b,"static void Test_Template_TemplateCache::Run()");
        }
        local_68._0_8_ = filename_b._M_dataplus._M_p;
        local_68._8_8_ = filename_b._M_string_length;
        local_68[0x10] = '\0';
        local_68._24_8_ = 0;
        lVar2 = ctemplate::Template::GetTemplate((TemplateString *)local_68,STRIP_BLANK_LINES);
        if (lVar2 == 0) {
          printf("ASSERT FAILED, line %d: %s\n",0x51c,
                 "tpl2 = Template::GetTemplate(filename_b, STRIP_BLANK_LINES)");
          local_68._0_8_ = filename_b._M_dataplus._M_p;
          local_68._8_8_ = filename_b._M_string_length;
          local_68[0x10] = '\0';
          local_68._24_8_ = 0;
          lVar1 = ctemplate::Template::GetTemplate((TemplateString *)local_68,STRIP_BLANK_LINES);
          if (lVar1 == 0) {
            __assert_fail("tpl2 = Template::GetTemplate(filename_b, STRIP_BLANK_LINES)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                          ,0x51c,"static void Test_Template_TemplateCache::Run()");
          }
        }
        else {
          if (lVar2 == lVar1) {
            printf("ASSERT FAILED, line %d: %s\n",0x51d,"tpl2 != tpl");
            __assert_fail("tpl2 != tpl",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                          ,0x51d,"static void Test_Template_TemplateCache::Run()");
          }
          local_68._0_8_ = filename_a._M_dataplus._M_p;
          local_68._8_8_ = filename_a._M_string_length;
          local_68[0x10] = '\0';
          local_68._24_8_ = 0;
          lVar2 = ctemplate::Template::GetTemplate((TemplateString *)local_68,DO_NOT_STRIP);
          if (lVar2 != 0) {
            if (lVar2 == lVar1) {
              std::__cxx11::string::~string((string *)&filename_b);
              std::__cxx11::string::~string((string *)&filename_a);
              return;
            }
            printf("ASSERT FAILED, line %d: %s\n",0x51f,"tpl2 == tpl");
            __assert_fail("tpl2 == tpl",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                          ,0x51f,"static void Test_Template_TemplateCache::Run()");
          }
          printf("ASSERT FAILED, line %d: %s\n",0x51e,
                 "tpl2 = Template::GetTemplate(filename_a, DO_NOT_STRIP)");
          local_68._0_8_ = filename_a._M_dataplus._M_p;
          local_68._8_8_ = filename_a._M_string_length;
          local_68[0x10] = '\0';
          local_68._24_8_ = 0;
          lVar1 = ctemplate::Template::GetTemplate((TemplateString *)local_68,DO_NOT_STRIP);
          if (lVar1 == 0) {
            __assert_fail("tpl2 = Template::GetTemplate(filename_a, DO_NOT_STRIP)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                          ,0x51e,"static void Test_Template_TemplateCache::Run()");
          }
        }
      }
    }
  }
  exit(1);
}

Assistant:

TEST(Template, TemplateCache) {
  const string filename_a = StringToTemplateFile("Test template 1");
  const string filename_b = StringToTemplateFile("Test template 2.");

  Template *tpl, *tpl2;
  ASSERT(tpl = Template::GetTemplate(filename_a, DO_NOT_STRIP));

  ASSERT(tpl2 = Template::GetTemplate(filename_b, DO_NOT_STRIP));
  ASSERT(tpl2 != tpl);  // different filenames.
  ASSERT(tpl2 = Template::GetTemplate(filename_a, STRIP_BLANK_LINES));
  ASSERT(tpl2 != tpl);  // different strip.
  ASSERT(tpl2 = Template::GetTemplate(filename_b, STRIP_BLANK_LINES));
  ASSERT(tpl2 != tpl);  // different filenames and strip.
  ASSERT(tpl2 = Template::GetTemplate(filename_a, DO_NOT_STRIP));
  ASSERT(tpl2 == tpl);  // same filename and strip.
}